

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O1

void av1_xform(MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
              TxfmParam *txfm_param)

{
  undefined7 in_register_00000089;
  
  av1_fwd_txfm(x->plane[plane].src_diff +
               (int)((blk_row * (uint)block_size_wide
                                      [CONCAT71(in_register_00000089,plane_bsize) & 0xffffffff] +
                     blk_col) * 4),x->plane[plane].coeff + (block << 4),
               (uint)block_size_wide[CONCAT71(in_register_00000089,plane_bsize) & 0xffffffff],
               txfm_param);
  return;
}

Assistant:

void av1_xform(MACROBLOCK *x, int plane, int block, int blk_row, int blk_col,
               BLOCK_SIZE plane_bsize, TxfmParam *txfm_param) {
  const struct macroblock_plane *const p = &x->plane[plane];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *const coeff = p->coeff + block_offset;
  const int diff_stride = block_size_wide[plane_bsize];

  const int src_offset = (blk_row * diff_stride + blk_col);
  const int16_t *src_diff = &p->src_diff[src_offset << MI_SIZE_LOG2];

  av1_fwd_txfm(src_diff, coeff, diff_stride, txfm_param);
}